

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void free_monchn(monst *mon)

{
  monst *pmVar1;
  
  if (mon != (monst *)0x0) {
    do {
      pmVar1 = mon->nmon;
      if (mon->minvent != (obj *)0x0) {
        free_objchn(mon->minvent);
      }
      free(mon);
      mon = pmVar1;
    } while (pmVar1 != (monst *)0x0);
  }
  return;
}

Assistant:

static void free_monchn(struct monst *mon)
{
	struct monst *mtmp2;

	while (mon) {
	    mtmp2 = mon->nmon;
	    
	    if (mon->minvent)
		free_objchn(mon->minvent);
	    dealloc_monst(mon);
	    mon = mtmp2;
	}
}